

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_smart_pointers.cpp
# Opt level: O2

int main(void)

{
  CurrentAccount *ca;
  ostream *poVar1;
  shared_ptr<CurrentAccount> sVar2;
  shared_ptr<CurrentAccount> smart_ptr;
  
  ca = (CurrentAccount *)operator_new(0x10);
  (ca->super_IBankAccount)._vptr_IBankAccount = (_func_int **)&PTR__IBankAccount_00103ce0;
  ca->m_balance = 200;
  poVar1 = operator<<((ostream *)&std::cout,ca);
  std::endl<char,std::char_traits<char>>(poVar1);
  (*(ca->super_IBankAccount)._vptr_IBankAccount[1])(ca);
  sVar2 = std::make_shared<CurrentAccount,int>((int *)&smart_ptr);
  (*((smart_ptr.super___shared_ptr<CurrentAccount,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_IBankAccount)._vptr_IBankAccount[2])
            (smart_ptr.super___shared_ptr<CurrentAccount,_(__gnu_cxx::_Lock_policy)2>._M_ptr,100,
             sVar2.super___shared_ptr<CurrentAccount,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
             _M_pi);
  poVar1 = operator<<((ostream *)&std::cout,
                      smart_ptr.super___shared_ptr<CurrentAccount,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = operator<<((ostream *)&std::cout,
                      smart_ptr.super___shared_ptr<CurrentAccount,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&smart_ptr.super___shared_ptr<CurrentAccount,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return 0;
}

Assistant:

int main()
{
	auto dumb_ptr{new CurrentAccount(100)};
	dumb_ptr->deposit(100);
	std::cout << *dumb_ptr << std::endl;
	delete dumb_ptr;

	auto smart_ptr{std::make_shared<CurrentAccount>(100)};
	smart_ptr->deposit(100);
	std::cout << *smart_ptr << std::endl;
	CurrentAccount* underlying_ptr{smart_ptr.get()};
	std::cout << *underlying_ptr << std::endl;

	return 0;
}